

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> * __thiscall
pstore::romfs::romfs::parse_path
          (error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> *__return_storage_ptr__,
          romfs *this,not_null<const_char_*> path,not_null<const_pstore::romfs::directory_*> dir)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  not_null<const_char_*> nVar4;
  unsigned_long length;
  iterator __name;
  iterator iVar5;
  not_null<const_pstore::romfs::directory_*> *pnVar6;
  long value;
  error_code erc;
  error_code eVar7;
  undefined8 uStack_70;
  not_null<const_char_*> local_60;
  not_null<const_char_*> local_58;
  dirent *current_de;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> eo_directory;
  
  if (dir.ptr_ == (directory *)0x0 || path.ptr_ == (char *)0x0) {
    get_romfs_error_category();
    uStack_70 = 2;
  }
  else {
    if (*path.ptr_ == '/') {
      dir.ptr_ = (this->root_).ptr_;
      path = anon_unknown.dwarf_cd24b::next_component(path);
    }
    current_de = (dirent *)directory_to_dirent(dir);
    if ((current_de->stat_).mode != directory) {
      assert_failed("current_de->is_directory ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                    ,0x143);
    }
    do {
      while( true ) {
        cVar3 = *path.ptr_;
        if (cVar3 == '\0') {
          error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
          error_or<pstore::romfs::dirent_const*&,void>
                    ((error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>> *)
                     __return_storage_ptr__,&current_de);
          return __return_storage_ptr__;
        }
        value = 0;
        while ((cVar3 != '\0' && (cVar3 != '/'))) {
          lVar1 = value + 1;
          value = value + 1;
          cVar3 = path.ptr_[lVar1];
        }
        local_58.ptr_ = path.ptr_ + value;
        gsl::not_null<const_char_*>::ensure_invariant(&local_58);
        nVar4 = anon_unknown.dwarf_cd24b::next_component(local_58);
        if (path.ptr_ + value <= path.ptr_) {
          assert_failed("tail > component",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                        ,0x14b);
        }
        local_60.ptr_ = path.ptr_;
        gsl::not_null<const_char_*>::ensure_invariant(&local_60);
        length = unsigned_cast<long,unsigned_long,void>(value);
        __name = directory::find(dir.ptr_,local_60,length);
        iVar5 = directory::end(dir.ptr_);
        if (__name.pos_ == iVar5.pos_) {
          get_romfs_error_category();
          uStack_70 = 2;
          goto LAB_00135fd0;
        }
        path = nVar4;
        current_de = (dirent *)__name;
        if (((__name.pos_)->stat_).mode != directory) break;
        dirent::opendir((dirent *)&eo_directory,(char *)__name.pos_);
        bVar2 = eo_directory.has_error_;
        if (eo_directory.has_error_ == true) {
          eVar7 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                            (&eo_directory);
          erc._M_cat = eVar7._M_cat;
          erc._4_4_ = 0;
          erc._M_value = eVar7._M_value;
          error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::error_or
                    (__return_storage_ptr__,erc);
        }
        else {
          pnVar6 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                   value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                             (&eo_directory);
          dir.ptr_ = pnVar6->ptr_;
        }
        error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or(&eo_directory)
        ;
        if (bVar2 != false) {
          return __return_storage_ptr__;
        }
      }
    } while (*nVar4.ptr_ == '\0');
    get_romfs_error_category();
    uStack_70 = 0x14;
  }
LAB_00135fd0:
  eVar7._M_cat = &get_romfs_error_category::cat.super_error_category;
  eVar7._0_8_ = uStack_70;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::error_or
            (__return_storage_ptr__,eVar7);
  return __return_storage_ptr__;
}

Assistant:

auto romfs::parse_path (not_null<czstring> const path,
                                not_null<directory const *> dir) const -> error_or<dirent_ptr> {
            if (path.get () == nullptr || dir.get () == nullptr) {
                return error_or<dirent_ptr> (make_error_code (error_code::enoent));
            }

            auto p = path;
            if (p[0] == '/') {
                dir = root_;
                p = next_component (path);
            }

            dirent const * current_de = directory_to_dirent (dir);
            PSTORE_ASSERT (current_de->is_directory ());
            while (*p != '\0') {
                char const * component;
                char const * tail;
                std::tie (component, tail) = path_component (p);
                // note that component is not null terminated!
                p = next_component (tail);

                PSTORE_ASSERT (tail > component);
                auto const component_pos = dir->find (component, unsigned_cast (tail - component));
                if (component_pos == dir->end ()) {
                    // name not found
                    return error_or<dirent_ptr>{make_error_code (error_code::enoent)};
                }

                current_de = &*component_pos;
                if (current_de->is_directory ()) {
                    auto eo_directory = current_de->opendir ();
                    if (!eo_directory) {
                        return error_or<dirent_ptr>{eo_directory.get_error ()};
                    }
                    dir = eo_directory.get ();
                } else if (*p != '\0') {
                    // not a directory and wasn't the last component.
                    return error_or<dirent_ptr> (make_error_code (error_code::enotdir));
                }
            }
            return error_or<dirent_ptr>{current_de};
        }